

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

void pcp_flow_updated(pcp_flow_t *f)

{
  pcp_server_t *ppVar1;
  pcp_server_t *s;
  timeval curtime;
  pcp_flow_t *f_local;
  
  if (f != (pcp_flow_t *)0x0) {
    curtime.tv_usec = (__suseconds_t)f;
    gettimeofday((timeval *)&s,(__timezone_ptr_t)0x0);
    ppVar1 = get_pcp_server(*(pcp_ctx_t **)curtime.tv_usec,*(int *)(curtime.tv_usec + 0xa0));
    if (ppVar1 != (pcp_server_t *)0x0) {
      (ppVar1->next_timeout).tv_sec = (__time_t)s;
      (ppVar1->next_timeout).tv_usec = curtime.tv_sec;
    }
    pcp_flow_clear_msg_buf((pcp_flow_t *)curtime.tv_usec);
    *(pcp_server_t **)(curtime.tv_usec + 0xb8) = s;
    *(__time_t *)(curtime.tv_usec + 0xc0) = curtime.tv_sec;
    if (((*(int *)(curtime.tv_usec + 0xa4) != 1) && (*(int *)(curtime.tv_usec + 0xa4) != 0)) &&
       (*(int *)(curtime.tv_usec + 0xa4) != 7)) {
      *(undefined4 *)(curtime.tv_usec + 0xa4) = 2;
    }
  }
  return;
}

Assistant:

void pcp_flow_updated(pcp_flow_t *f) {
    struct timeval curtime;
    pcp_server_t *s;

    if (!f)
        return;

    gettimeofday(&curtime, NULL);
    s = get_pcp_server(f->ctx, f->pcp_server_indx);
    if (s) {
        s->next_timeout = curtime;
    }
    pcp_flow_clear_msg_buf(f);
    f->timeout = curtime;
    if ((f->state != pfs_wait_for_server_init) && (f->state != pfs_idle) &&
        (f->state != pfs_failed)) {
        f->state = pfs_send;
    }
}